

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O3

int64_t GetVirtualTransactionInputSize(CTxIn *txin,int64_t nSigOpCost,uint bytes_per_sigop)

{
  TransactionSerParams *pTVar1;
  long lVar2;
  TransactionSerParams *pTVar3;
  long in_FS_OFFSET;
  SizeComputer local_50;
  ParamsStream<SizeComputer_&,_TransactionSerParams> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.m_params = &TX_NO_WITNESS;
  local_50.nSize = 0x24;
  local_48.m_substream = &local_50;
  SerializeMany<ParamsStream<SizeComputer&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
            (&local_48,&(txin->scriptSig).super_CScriptBase);
  (local_48.m_substream)->nSize = (local_48.m_substream)->nSize + 4;
  lVar2 = local_50.nSize * 3;
  local_48.m_params = &TX_WITH_WITNESS;
  local_50.nSize = 0x24;
  local_48.m_substream = &local_50;
  SerializeMany<ParamsStream<SizeComputer&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
            (&local_48,&(txin->scriptSig).super_CScriptBase);
  (local_48.m_substream)->nSize = (local_48.m_substream)->nSize + 4;
  lVar2 = lVar2 + local_50.nSize;
  local_48.m_params = (TransactionSerParams *)0x0;
  VectorFormatter<DefaultFormatter>::
  Ser<SizeComputer,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((VectorFormatter<DefaultFormatter> *)&local_50,(SizeComputer *)&local_48,
             &(txin->scriptWitness).stack);
  pTVar3 = local_48.m_params + lVar2;
  pTVar1 = (TransactionSerParams *)((ulong)bytes_per_sigop * nSigOpCost);
  if ((long)pTVar1 - (long)pTVar3 == 0 || (long)pTVar1 < (long)pTVar3) {
    pTVar1 = pTVar3;
  }
  pTVar3 = pTVar1 + 6;
  if (-1 < (long)(pTVar1 + 3)) {
    pTVar3 = pTVar1 + 3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (long)pTVar3 >> 2;
  }
  __stack_chk_fail();
}

Assistant:

int64_t GetVirtualTransactionInputSize(const CTxIn& txin, int64_t nSigOpCost, unsigned int bytes_per_sigop)
{
    return GetVirtualTransactionSize(GetTransactionInputWeight(txin), nSigOpCost, bytes_per_sigop);
}